

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# display.cpp
# Opt level: O2

bool __thiscall pbrt::IPCChannel::Send(IPCChannel *this,span<const_unsigned_char> message)

{
  ssize_t sVar1;
  string asStackY_38 [4];
  int in_stack_ffffffffffffffcc;
  
  if ((this->socketFd != -1) || (Connect(this), this->socketFd != -1)) {
    *(int *)message.ptr = (int)message.n;
    sVar1 = send(this->socketFd,message.ptr,message.n,0);
    if ((long)(int)sVar1 == message.n) {
      return true;
    }
    if (LOGGING_LogLevel < 2) {
      LastError();
      ErrorString_abi_cxx11_(in_stack_ffffffffffffffcc);
      Log<std::__cxx11::string>
                (Error,
                 "/workspace/llm4binary/github/license_all_cmakelists_25/anderslanglands[P]pbrt-v4/src/pbrt/util/display.cpp"
                 ,0xba,"send to display server failed: %s",
                 (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)asStackY_38);
      std::__cxx11::string::~string(asStackY_38);
    }
    Disconnect(this);
  }
  return false;
}

Assistant:

bool IPCChannel::Send(pstd::span<const uint8_t> message) {
    if (!Connected()) {
        Connect();
        if (!Connected())
            return false;
    }

    // Start with the length of the message.
    // FIXME: annoying coupling w/sending code's message buffer layout...
    int *startPtr = (int *)message.data();
    *startPtr = message.size();

    int bytesSent = send(socketFd, (const char *)message.data(), message.size(), 0 /* flags */);
    if (bytesSent == message.size())
        return true;

    LOG_ERROR("send to display server failed: %s", ErrorString());
    Disconnect();
    return false;
}